

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currunit.cpp
# Opt level: O3

void __thiscall
icu_63::CurrencyUnit::CurrencyUnit(CurrencyUnit *this,MeasureUnit *other,UErrorCode *ec)

{
  int iVar1;
  char *pcVar2;
  
  MeasureUnit::MeasureUnit(&this->super_MeasureUnit,other);
  (this->super_MeasureUnit).super_UObject._vptr_UObject = (_func_int **)&PTR__CurrencyUnit_003b0c68;
  pcVar2 = MeasureUnit::getType(&this->super_MeasureUnit);
  iVar1 = strcmp("currency",pcVar2);
  if (iVar1 == 0) {
    pcVar2 = MeasureUnit::getSubtype(&this->super_MeasureUnit);
    u_charsToUChars_63(pcVar2,(UChar *)&(this->super_MeasureUnit).field_0x14,4);
    *(undefined2 *)&this->field_0x1a = 0;
  }
  else {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    *(undefined2 *)&(this->super_MeasureUnit).field_0x14 = 0;
  }
  return;
}

Assistant:

CurrencyUnit::CurrencyUnit(const MeasureUnit& other, UErrorCode& ec) : MeasureUnit(other) {
    // Make sure this is a currency.
    // OK to hard-code the string because we are comparing against another hard-coded string.
    if (uprv_strcmp("currency", getType()) != 0) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        isoCode[0] = 0;
    } else {
        // Get the ISO Code from the subtype field.
        u_charsToUChars(getSubtype(), isoCode, 4);
        isoCode[3] = 0; // make 100% sure it is NUL-terminated
    }
}